

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enum.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseEnum(Parser *this)

{
  Token *pTVar1;
  size_t sVar2;
  Token *pTVar3;
  Lexer *lexer;
  size_t sVar4;
  bool bVar5;
  Lexer *this_00;
  Parser *in_RSI;
  pointer __p;
  initializer_list<pfederc::Position> __l;
  bool err;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  constructors;
  bool local_da;
  allocator_type local_d9;
  Position local_d8;
  Error<pfederc::SyntaxErrorCode> *local_c0;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  local_b8;
  TemplateDecls local_98;
  Position local_78;
  undefined1 local_60 [8];
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  
  pTVar1 = in_RSI->lexer->currentToken;
  local_78.line = (pTVar1->pos).line;
  local_78.startIndex = (pTVar1->pos).startIndex;
  local_78.endIndex = (pTVar1->pos).endIndex;
  sanityExpect(in_RSI,TOK_KW_ENUM);
  local_da = false;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = Token::operator==(in_RSI->lexer->currentToken,TOK_OP_TEMPL_BRACKET_OPEN);
  if (bVar5) {
    parseTemplateDecl((TemplateDecls *)&local_d8,in_RSI);
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8.line;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8.startIndex;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8.endIndex;
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.line = 0;
    local_d8.startIndex = 0;
    local_d8.endIndex = 0;
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
               *)&local_b8);
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
               *)&local_d8);
  }
  pTVar1 = in_RSI->lexer->currentToken;
  bVar5 = expect(in_RSI,TOK_ID);
  if (!bVar5) {
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
    sVar2 = (pTVar1->pos).endIndex;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_ID;
    sVar4 = (pTVar1->pos).startIndex;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).line = (pTVar1->pos).line;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).startIndex = sVar4;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).endIndex = sVar2;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)((long)local_58 + 8U),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               ((long)local_58 + 8U));
    if ((Error<pfederc::SyntaxErrorCode> *)
        local_b8.
        super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_b8,
                 (Error<pfederc::SyntaxErrorCode> *)
                 local_b8.
                 super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    local_da = true;
  }
  bVar5 = expect(in_RSI,TOK_EOL);
  if (!bVar5) {
    pTVar3 = in_RSI->lexer->currentToken;
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
    sVar2 = (pTVar3->pos).endIndex;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_b8.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_EOL;
    sVar4 = (pTVar3->pos).startIndex;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).line = (pTVar3->pos).line;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).startIndex = sVar4;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).endIndex = sVar2;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_b8.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)local_58,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_58)
    ;
    if ((Error<pfederc::SyntaxErrorCode> *)
        local_b8.
        super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_b8,
                 (Error<pfederc::SyntaxErrorCode> *)
                 local_b8.
                 super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_b8.
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parseEnumBody(in_RSI,&local_da,&local_b8);
  bVar5 = expect(in_RSI,TOK_STMT);
  if (bVar5) {
    if ((local_da & 1U) == 0) {
      lexer = in_RSI->lexer;
      Position::operator+(&local_78,&pTVar1->pos);
      this_00 = (Lexer *)operator_new(0x70);
      EnumExpr::EnumExpr((EnumExpr *)this_00,lexer,&local_d8,pTVar1,&local_98,&local_b8);
      local_48 = (pointer)0x0;
      this->lexer = this_00;
      std::unique_ptr<pfederc::EnumExpr,_std::default_delete<pfederc::EnumExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::EnumExpr,_std::default_delete<pfederc::EnumExpr>_> *)&local_48
                );
      goto LAB_00110dc3;
    }
  }
  else {
    pTVar3 = in_RSI->lexer->currentToken;
    local_48 = (pointer)(pTVar1->pos).line;
    puStack_40 = (pointer)(pTVar1->pos).startIndex;
    local_38 = (pointer)(pTVar1->pos).endIndex;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_48;
    std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
              ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)&local_d8,__l,
               &local_d9);
    local_c0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar2 = (pTVar3->pos).endIndex;
    local_c0->logLevel = LVL_ERROR;
    local_c0->err = STX_ERR_EXPECTED_STMT;
    sVar4 = (pTVar3->pos).startIndex;
    (local_c0->pos).line = (pTVar3->pos).line;
    (local_c0->pos).startIndex = sVar4;
    (local_c0->pos).endIndex = sVar2;
    (local_c0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_d8.line;
    (local_c0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8.startIndex;
    (local_c0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8.endIndex;
    local_d8.line = 0;
    local_d8.startIndex = 0;
    local_d8.endIndex = 0;
    generateError((Parser *)local_60,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_60)
    ;
    if (local_c0 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_c0,local_c0);
    }
    local_c0 = (Error<pfederc::SyntaxErrorCode> *)0x0;
    if ((pointer)local_d8.line != (pointer)0x0) {
      operator_delete((void *)local_d8.line,local_d8.endIndex - local_d8.line);
    }
    local_da = true;
  }
  this->lexer = (Lexer *)0x0;
LAB_00110dc3:
  std::
  vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector(&local_98);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseEnum() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_ENUM);

  bool err = false; // hard errors

  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
    // maybe soft error
  }

  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokId->getPosition()));
    err = true;
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::vector<EnumConstructor> constructors;
  parseEnumBody(err, constructors);

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { tokId->getPosition() }));
    err = true;
  }

  if (err)
    return nullptr;

  return std::make_unique<EnumExpr>(lexer, pos + tokId->getPosition(),
      tokId, std::move(templ), std::move(constructors));
}